

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  void *pvVar19;
  byte bVar20;
  size_t sVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  short sVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  ulong __n;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  char cVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  size_t *psVar42;
  ulong uVar43;
  size_t *psVar44;
  ulong uVar45;
  uint32_t *addr_1;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ushort uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  bool bVar54;
  bool bVar55;
  ulong uStack_180;
  ulong local_170;
  ulong local_140;
  ulong local_128;
  ulong local_110;
  ulong local_e8;
  ulong local_d0;
  ulong local_c0;
  ulong local_b8;
  size_t *local_a8;
  
  uVar15 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  uVar1 = position + num_bytes;
  uVar4 = (position - 3) + num_bytes;
  sVar21 = position;
  if (3 < num_bytes) {
    sVar21 = uVar4;
  }
  lVar22 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar22 = 0x40;
  }
  uVar5 = (position - 4) + num_bytes;
  lVar3 = position - 1;
  lVar9 = *(long *)(literal_context_lut + 0x10);
  uVar46 = *(ulong *)dist_cache;
  uVar24 = lVar22 + position;
  local_a8 = last_insert_len;
LAB_001075f5:
LAB_00107609:
  uVar33 = position;
  if (uVar1 <= uVar33 + 4) {
    *(ulong *)dist_cache = (uVar46 + uVar1) - uVar33;
    *(long *)commands = *(long *)commands + ((long)local_a8 - (long)last_insert_len >> 4);
    return;
  }
  local_110 = uVar1 - uVar33;
  uVar17 = uVar15;
  if (uVar33 < uVar15) {
    uVar17 = uVar33;
  }
  local_b8 = lVar9 + uVar33;
  if (uVar15 <= lVar9 + uVar33) {
    local_b8 = uVar15;
  }
  uVar23 = *(ulong *)(literal_context_lut + 0x50);
  lVar31 = *(long *)&params->dist;
  uVar30 = uVar33 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar30);
  uVar12 = (uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0x11;
  uVar41 = (ulong)uVar12;
  psVar44 = *(size_t **)backward_references;
  psVar42 = num_literals + (long)psVar44 * 2;
  do {
    bVar55 = back_refs_position == (size_t *)0x0;
    if (back_refs_position <= psVar44) {
LAB_00107752:
      uVar37 = (ulong)((uint)local_110 & 7);
      uVar48 = 0x7e4;
      uVar47 = 0;
      uVar32 = 0;
      lVar50 = 0;
      local_e8 = 0;
      do {
        cVar38 = (char)uVar12;
        if (lVar50 == 4) {
          lVar50 = *(long *)&(params->hasher).num_last_distances_to_check;
          uVar51 = uVar33 - *(uint *)(lVar31 + uVar41 * 4);
          uVar6 = *(ushort *)(lVar31 + 0x20000 + uVar41 * 2);
          uVar52 = (ulong)uVar6;
          uVar43 = 0;
          uVar36 = uVar51;
          uVar25 = local_e8;
          do {
            local_e8 = uVar25;
            uVar45 = uVar48;
            __n = uVar32;
            uVar16 = uVar47;
            uVar26 = uVar52;
            do {
              do {
                do {
                  do {
                    bVar54 = lVar50 == 0;
                    lVar50 = lVar50 + -1;
                    if ((bVar54) || (uVar43 = uVar43 + uVar36, uVar17 < uVar43)) {
                      uVar49 = (ushort)(params->hasher).block_bits;
                      *(ushort *)&(params->hasher).block_bits = uVar49 + 1;
                      *(char *)(lVar31 + 0x30000 + (uVar33 & 0xffff)) = cVar38;
                      if (0xfffe < uVar51) {
                        uVar51 = 0xffff;
                      }
                      *(short *)(lVar31 + 0x40000 + (ulong)uVar49 * 4) = (short)uVar51;
                      *(ushort *)(lVar31 + 0x40002 + (ulong)uVar49 * 4) = uVar6;
                      *(int *)(lVar31 + uVar41 * 4) = (int)uVar33;
                      *(ushort *)(lVar31 + 0x20000 + uVar41 * 2) = uVar49;
                      if (uVar45 != 0x7e4) {
                        iVar14 = 0;
                        bVar54 = true;
                        goto LAB_00107d17;
                      }
                      if (!bVar55) {
                        psVar44 = *(size_t **)backward_references;
                        goto LAB_00107d43;
                      }
                      lVar31 = *(long *)&(params->dist).alphabet_size_max;
                      uVar17 = *(ulong *)(lVar31 + 8);
                      local_140 = *(ulong *)(lVar31 + 0x10);
                      bVar55 = true;
                      if (local_140 < uVar17 >> 7) goto LAB_00107e31;
                      uVar41 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      lVar50 = *(long *)(literal_context_lut + 0x78);
                      uVar45 = 0x7e4;
                      iVar14 = 0;
                      lVar35 = 0;
                      goto LAB_00107b55;
                    }
                    uVar52 = (ulong)*(ushort *)(lVar31 + 0x40002 + uVar26 * 4);
                    uVar36 = (ulong)*(ushort *)(lVar31 + 0x40000 + uVar26 * 4);
                    uVar26 = uVar52;
                  } while (ringbuffer_mask < local_e8 + uVar30);
                  uVar47 = uVar33 - uVar43 & ringbuffer_mask;
                } while ((ringbuffer_mask < local_e8 + uVar47) ||
                        (ringbuffer[local_e8 + uVar30] != ringbuffer[local_e8 + uVar47]));
                uVar32 = 0;
                lVar35 = 0;
LAB_0010798f:
                uVar48 = uVar37;
                uVar25 = local_110 & 0xfffffffffffffff8;
                if (local_110 >> 3 == uVar32) {
                  for (; (uVar32 = local_110, uVar48 != 0 &&
                         (uVar32 = uVar25,
                         ringbuffer[uVar25 + uVar47] == *(uint8_t *)((long)piVar2 + uVar25)));
                      uVar25 = uVar25 + 1) {
                    uVar48 = uVar48 - 1;
                  }
                }
                else {
                  if (*(ulong *)(piVar2 + uVar32 * 2) ==
                      *(ulong *)(ringbuffer + uVar32 * 8 + uVar47)) goto code_r0x001079ac;
                  uVar32 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar47) ^
                           *(ulong *)(piVar2 + uVar32 * 2);
                  uVar47 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  uVar32 = (uVar47 >> 3 & 0x1fffffff) - lVar35;
                }
                if ((psVar44 < back_refs_position) && ((ulong)(long)(int)*psVar42 < uVar32 + uVar33)
                   ) {
                  uVar32 = (long)(int)*psVar42 - uVar33;
                }
              } while (uVar32 < 4);
              iVar14 = 0x1f;
              if ((uint)uVar43 != 0) {
                for (; (uint)uVar43 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              uVar48 = (ulong)(iVar14 * -0x1e + 0x780) + uVar32 * 0x87;
              uVar47 = uVar43;
              uVar25 = uVar32;
            } while (uVar48 <= uVar45);
          } while( true );
        }
        uVar25 = (ulong)*(int *)((long)&(hasher->common).extra + lVar50 * 4);
        uVar36 = uVar33 - uVar25;
        if ((((lVar50 == 0) || (*(char *)(lVar31 + 0x30000 + (uVar36 & 0xffff)) == cVar38)) &&
            (uVar25 <= uVar17)) && (uVar36 < uVar33)) {
          uVar43 = 0;
          lVar35 = 0;
LAB_001077ea:
          uVar51 = uVar37;
          uVar52 = local_110 & 0xfffffffffffffff8;
          if (local_110 >> 3 == uVar43) {
            for (; (uVar43 = local_110, uVar51 != 0 &&
                   (uVar43 = uVar52,
                   ringbuffer[uVar52 + (uVar36 & ringbuffer_mask)] ==
                   *(uint8_t *)((long)piVar2 + uVar52))); uVar52 = uVar52 + 1) {
              uVar51 = uVar51 - 1;
            }
          }
          else {
            if (*(ulong *)(piVar2 + uVar43 * 2) ==
                *(ulong *)(ringbuffer + uVar43 * 8 + (uVar36 & ringbuffer_mask)))
            goto code_r0x00107807;
            uVar43 = *(ulong *)(ringbuffer + uVar43 * 8 + (uVar36 & ringbuffer_mask)) ^
                     *(ulong *)(piVar2 + uVar43 * 2);
            uVar36 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            uVar43 = (uVar36 >> 3 & 0x1fffffff) - lVar35;
          }
          if ((psVar44 < back_refs_position) && ((ulong)(long)(int)*psVar42 < uVar43 + uVar33)) {
            uVar43 = (long)(int)*psVar42 - uVar33;
          }
          if ((1 < uVar43) && (uVar36 = uVar43 * 0x87 + 0x78f, uVar48 < uVar36)) {
            if (lVar50 != 0) {
              uVar36 = uVar36 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
            }
            if (uVar48 < uVar36) {
              uVar47 = uVar25;
              uVar32 = uVar43;
              uVar48 = uVar36;
              local_e8 = uVar43;
            }
          }
        }
        lVar50 = lVar50 + 1;
      } while( true );
    }
    if (uVar33 <= (ulong)(long)(int)*psVar42) {
      if (uVar33 == (long)(int)*psVar42) {
        uVar12 = (uint)psVar42[1];
        uVar16 = (ulong)(int)uVar12;
        if ((uVar33 <= uVar33 - uVar16) || (*(uint *)((long)psVar42 + 0xc) < uVar12))
        goto LAB_00107d43;
        uVar23 = uVar33 - uVar16 & ringbuffer_mask;
        uVar17 = local_110 & 0xfffffffffffffff8;
        uVar41 = 0;
        lVar31 = 0;
        goto LAB_0010771d;
      }
      bVar55 = false;
      goto LAB_00107752;
    }
    psVar44 = (size_t *)((long)psVar44 + 1);
    *(size_t **)backward_references = psVar44;
    psVar42 = psVar42 + 2;
  } while( true );
LAB_00107b55:
  if (lVar35 == 2) goto LAB_00107f8e;
  uVar17 = uVar17 + 1;
  *(ulong *)(lVar31 + 8) = uVar17;
  bVar20 = *(byte *)(lVar50 + uVar41);
  uVar30 = (ulong)bVar20;
  if ((uVar30 != 0) && (uVar30 <= local_110)) {
    uVar48 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar41 * 2);
    lVar10 = *(long *)(literal_context_lut + 0x58);
    lVar27 = uVar48 * uVar30 + *(long *)(lVar10 + 0xa8) +
             (ulong)*(uint *)(lVar10 + 0x20 + uVar30 * 4);
    uVar47 = (ulong)(bVar20 & 0xfffffff8);
    uVar32 = 0;
LAB_00107bc4:
    if (uVar47 == uVar32) {
      uVar37 = (ulong)(bVar20 & 7);
      pcVar28 = (char *)(lVar27 + uVar32);
      for (; (bVar55 = uVar37 != 0, uVar37 = uVar37 - 1, uVar32 = uVar30, bVar55 &&
             (uVar32 = uVar47, *(char *)((long)piVar2 + uVar47) == *pcVar28)); uVar47 = uVar47 + 1)
      {
        pcVar28 = pcVar28 + 1;
      }
    }
    else {
      uVar37 = *(ulong *)(lVar27 + uVar32);
      if (uVar37 == *(ulong *)((long)piVar2 + uVar32)) goto code_r0x00107bdf;
      uVar37 = *(ulong *)((long)piVar2 + uVar32) ^ uVar37;
      uVar47 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
        }
      }
      uVar32 = (uVar47 >> 3 & 0x1fffffff) + uVar32;
    }
    if (((uVar32 != 0) && (uVar30 < *(uint *)(literal_context_lut + 100) + uVar32)) &&
       (uVar30 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar30 - uVar32) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar30 - uVar32) * 4 << (*(byte *)(lVar10 + uVar30) & 0x3f)) +
                 uVar48 + local_b8 + 1, uVar30 <= uVar23)) {
      iVar34 = 0x1f;
      if ((uint)uVar30 != 0) {
        for (; (uint)uVar30 >> iVar34 == 0; iVar34 = iVar34 + -1) {
        }
      }
      uVar47 = (uVar32 * 0x87 - (ulong)(uint)(iVar34 * 0x1e)) + 0x780;
      if (uVar45 <= uVar47) {
        iVar14 = (uint)bVar20 - (int)uVar32;
        local_140 = local_140 + 1;
        *(ulong *)(lVar31 + 0x10) = local_140;
        uVar45 = uVar47;
        __n = uVar32;
        uVar16 = uVar30;
      }
    }
  }
  lVar35 = lVar35 + 1;
  uVar41 = uVar41 + 1;
  goto LAB_00107b55;
LAB_00107f8e:
  bVar55 = true;
  bVar54 = true;
  goto LAB_00107d17;
code_r0x00107bdf:
  uVar32 = uVar32 + 8;
  goto LAB_00107bc4;
code_r0x001079ac:
  lVar35 = lVar35 + -8;
  uVar32 = uVar32 + 1;
  goto LAB_0010798f;
code_r0x00107807:
  lVar35 = lVar35 + -8;
  uVar43 = uVar43 + 1;
  goto LAB_001077ea;
LAB_0010771d:
  if (local_110 >> 3 == uVar41) goto LAB_00108029;
  if (*(ulong *)(piVar2 + uVar41 * 2) != *(ulong *)(ringbuffer + uVar41 * 8 + uVar23)) {
    uVar23 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar23) ^ *(ulong *)(piVar2 + uVar41 * 2);
    uVar17 = 0;
    if (uVar23 != 0) {
      for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    uVar30 = (uVar17 >> 3 & 0x1fffffff) - lVar31;
    goto LAB_00107fb7;
  }
  lVar31 = lVar31 + -8;
  uVar41 = uVar41 + 1;
  goto LAB_0010771d;
LAB_00108029:
  uVar41 = (ulong)((uint)local_110 & 7);
  for (; (bVar55 = uVar41 != 0, uVar41 = uVar41 - 1, uVar30 = local_110, bVar55 &&
         (uVar30 = uVar17, ringbuffer[uVar17 + uVar23] == *(uint8_t *)((long)piVar2 + uVar17)));
      uVar17 = uVar17 + 1) {
  }
LAB_00107fb7:
  __n = (long)*(int *)((long)psVar42 + 4);
  if (uVar30 < (ulong)(long)*(int *)((long)psVar42 + 4)) {
    __n = uVar30;
  }
  iVar14 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> iVar14 == 0; iVar14 = iVar14 + -1) {
    }
  }
  uVar45 = (ulong)(iVar14 * -0x1e + 0x780) + __n * 0x87;
  bVar55 = false;
  bVar54 = false;
  iVar14 = 0;
LAB_00107d17:
  if (0x7e4 < uVar45) goto LAB_00108059;
LAB_00107e31:
  uVar46 = uVar46 + 1;
  position = uVar33 + 1;
  if (bVar55 && uVar24 < position) {
    if (uVar24 + (uint)((int)lVar22 * 4) < position) {
      uVar17 = uVar33 + 0x11;
      if (uVar5 <= uVar33 + 0x11) {
        uVar17 = uVar5;
      }
      for (; position < uVar17; position = position + 4) {
        lVar31 = *(long *)&params->dist;
        uVar12 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar33 = (ulong)uVar12;
        uVar6 = (ushort)(params->hasher).block_bits;
        *(ushort *)&(params->hasher).block_bits = uVar6 + 1;
        uVar23 = position - *(uint *)(lVar31 + uVar33 * 4);
        *(char *)(lVar31 + 0x30000 + (position & 0xffff)) = (char)uVar12;
        if (0xfffe < uVar23) {
          uVar23 = 0xffff;
        }
        *(short *)(lVar31 + 0x40000 + (ulong)uVar6 * 4) = (short)uVar23;
        *(undefined2 *)(lVar31 + 0x40002 + (ulong)uVar6 * 4) =
             *(undefined2 *)(lVar31 + 0x20000 + uVar33 * 2);
        *(int *)(lVar31 + uVar33 * 4) = (int)position;
        *(ushort *)(lVar31 + 0x20000 + uVar33 * 2) = uVar6;
        uVar46 = uVar46 + 4;
      }
    }
    else {
      uVar17 = uVar33 + 9;
      if (uVar4 <= uVar33 + 9) {
        uVar17 = uVar4;
      }
      for (; position < uVar17; position = position + 2) {
        lVar31 = *(long *)&params->dist;
        uVar12 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar33 = (ulong)uVar12;
        uVar6 = (ushort)(params->hasher).block_bits;
        *(ushort *)&(params->hasher).block_bits = uVar6 + 1;
        uVar23 = position - *(uint *)(lVar31 + uVar33 * 4);
        *(char *)(lVar31 + 0x30000 + (position & 0xffff)) = (char)uVar12;
        if (0xfffe < uVar23) {
          uVar23 = 0xffff;
        }
        *(short *)(lVar31 + 0x40000 + (ulong)uVar6 * 4) = (short)uVar23;
        *(undefined2 *)(lVar31 + 0x40002 + (ulong)uVar6 * 4) =
             *(undefined2 *)(lVar31 + 0x20000 + uVar33 * 2);
        *(int *)(lVar31 + uVar33 * 4) = (int)position;
        *(ushort *)(lVar31 + 0x20000 + uVar33 * 2) = uVar6;
        uVar46 = uVar46 + 2;
      }
    }
  }
  goto LAB_00107609;
LAB_00107d43:
  if ((psVar44 < back_refs_position) && (uVar33 == (long)(int)num_literals[(long)psVar44 * 2])) {
    uVar12 = (uint)num_literals[(long)psVar44 * 2 + 1];
    uVar16 = (ulong)(int)uVar12;
    if (*(int *)((long)num_literals + (long)psVar44 * 0x10 + 0xc) < (int)uVar12) {
      uVar40 = *(uint *)((long)num_literals + (long)psVar44 * 0x10 + 4);
      uVar23 = (ulong)uVar40;
      if (uVar40 - 4 < 0x15 && (int)uVar12 < 0x7ffffffd) {
        uVar39 = ~(uint)uVar17 + uVar12;
        lVar31 = *(long *)(literal_context_lut + 0x58);
        iVar14 = (int)uVar39 >> (*(byte *)(lVar31 + uVar23) & 0x1f);
        if (iVar14 < *(int *)(literal_context_lut + 0x60)) {
          uVar8 = *(uint *)(lVar31 + 0x20 + uVar23 * 4);
          uVar7 = kBitMask[*(byte *)(lVar31 + uVar23)];
          lVar31 = *(long *)(lVar31 + 0xa8);
          uVar18 = BrotliGetTransforms();
          pvVar19 = malloc(uVar23 * 10);
          iVar14 = BrotliTransformDictionaryWord
                             (pvVar19,(ulong)uVar8 + lVar31 + (long)(int)((uVar39 & uVar7) * uVar40)
                              ,uVar40,uVar18,iVar14);
          __n = (ulong)iVar14;
          iVar34 = bcmp(piVar2,pvVar19,__n);
          if (iVar34 != 0) {
            bVar55 = false;
            goto LAB_00107e31;
          }
          iVar34 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          uVar45 = (ulong)(iVar34 * -0x1e + 0x780) + __n * 0x87;
          iVar14 = uVar40 - iVar14;
          bVar55 = false;
          bVar54 = false;
          goto LAB_00107d17;
        }
      }
    }
  }
  bVar55 = false;
  goto LAB_00107e31;
LAB_00108059:
  if (bVar54) {
    uVar24 = (lVar3 + num_bytes) - uVar33;
    uVar12 = 0;
    local_c0 = uVar24;
    do {
      uVar17 = (ulong)((uint)uVar24 & 7);
      uVar23 = uVar24 >> 3;
      local_110 = local_110 - 1;
      local_d0 = __n - 1;
      if (local_110 <= __n - 1) {
        local_d0 = local_110;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        local_d0 = 0;
      }
      uVar41 = uVar33 + 1;
      uVar30 = uVar15;
      if (uVar41 < uVar15) {
        uVar30 = uVar41;
      }
      local_b8 = lVar9 + uVar33 + 1;
      if (uVar15 <= local_b8) {
        local_b8 = uVar15;
      }
      uVar47 = *(ulong *)(literal_context_lut + 0x50);
      lVar31 = *(long *)&params->dist;
      uVar32 = uVar41 & ringbuffer_mask;
      piVar2 = (int *)(ringbuffer + uVar32);
      uVar40 = (uint)(*(int *)(ringbuffer + uVar32) * 0x1e35a7bd) >> 0x11;
      uVar48 = (ulong)uVar40;
      psVar44 = *(size_t **)backward_references;
      psVar42 = num_literals + (long)psVar44 * 2;
LAB_00108173:
      if (back_refs_position <= psVar44) {
LAB_00108199:
        uVar36 = 0x7e4;
        uVar37 = 0;
        local_128 = 0;
        for (lVar50 = 0; cVar38 = (char)uVar40, lVar50 != 4; lVar50 = lVar50 + 1) {
          uVar43 = (ulong)*(int *)((long)&(hasher->common).extra + lVar50 * 4);
          uVar25 = uVar41 - uVar43;
          if ((((lVar50 == 0) || (*(char *)(lVar31 + 0x30000 + (uVar25 & 0xffff)) == cVar38)) &&
              (uVar43 <= uVar30)) && (uVar25 < uVar41)) {
            uVar51 = 0;
            lVar35 = 0;
LAB_00108215:
            if (uVar23 == uVar51) {
              uVar52 = uVar17;
              for (uVar51 = -lVar35;
                  (bVar54 = uVar52 != 0, uVar52 = uVar52 - 1, bVar54 &&
                  (ringbuffer[uVar51 + (uVar25 & ringbuffer_mask)] ==
                   *(uint8_t *)((long)piVar2 + uVar51))); uVar51 = uVar51 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar51 * 2) ==
                  *(ulong *)(ringbuffer + uVar51 * 8 + (uVar25 & ringbuffer_mask)))
              goto code_r0x00108232;
              uVar51 = *(ulong *)(ringbuffer + uVar51 * 8 + (uVar25 & ringbuffer_mask)) ^
                       *(ulong *)(piVar2 + uVar51 * 2);
              uVar25 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar51 = (uVar25 >> 3 & 0x1fffffff) - lVar35;
            }
            if ((psVar44 < back_refs_position && !bVar55) &&
               ((ulong)(long)(int)*psVar42 < uVar51 + uVar41)) {
              uVar51 = (long)(int)*psVar42 - uVar41;
            }
            if ((1 < uVar51) && (uVar25 = uVar51 * 0x87 + 0x78f, uVar36 < uVar25)) {
              if (lVar50 != 0) {
                uVar25 = uVar25 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
              }
              if (uVar36 < uVar25) {
                uVar37 = uVar43;
                uVar36 = uVar25;
                local_128 = uVar51;
                local_d0 = uVar51;
              }
            }
          }
        }
        lVar50 = *(long *)&(params->hasher).num_last_distances_to_check;
        uVar52 = uVar41 - *(uint *)(lVar31 + uVar48 * 4);
        uVar6 = *(ushort *)(lVar31 + 0x20000 + uVar48 * 2);
        uVar51 = 0;
        uVar25 = uVar52;
        uVar49 = uVar6;
        uVar43 = local_d0;
        do {
          local_d0 = uVar43;
          local_170 = local_128;
          uVar26 = uVar36;
          uVar53 = uVar37;
          do {
            do {
              do {
                do {
                  bVar54 = lVar50 == 0;
                  lVar50 = lVar50 + -1;
                  if ((bVar54) || (uVar51 = uVar51 + uVar25, uVar30 < uVar51)) {
                    uVar49 = (ushort)(params->hasher).block_bits;
                    *(ushort *)&(params->hasher).block_bits = uVar49 + 1;
                    *(char *)(lVar31 + 0x30000 + (uVar41 & 0xffff)) = cVar38;
                    if (0xfffe < uVar52) {
                      uVar52 = 0xffff;
                    }
                    *(short *)(lVar31 + 0x40000 + (ulong)uVar49 * 4) = (short)uVar52;
                    *(ushort *)(lVar31 + 0x40002 + (ulong)uVar49 * 4) = uVar6;
                    *(int *)(lVar31 + uVar48 * 4) = (int)uVar41;
                    *(ushort *)(lVar31 + 0x20000 + uVar48 * 2) = uVar49;
                    iVar34 = 0;
                    if (uVar26 != 0x7e4) goto LAB_0010889e;
                    if (!bVar55) {
                      psVar44 = *(size_t **)backward_references;
                      goto LAB_00108848;
                    }
                    lVar31 = *(long *)&(params->dist).alphabet_size_max;
                    uVar17 = *(ulong *)(lVar31 + 8);
                    local_140 = *(ulong *)(lVar31 + 0x10);
                    if (local_140 < uVar17 >> 7) goto LAB_0010887a;
                    uVar23 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    lVar50 = *(long *)(literal_context_lut + 0x78);
                    uVar26 = 0x7e4;
                    iVar34 = 0;
                    lVar35 = 0;
                    goto LAB_001085b4;
                  }
                  uVar37 = (ulong)uVar49;
                  uVar49 = *(ushort *)(lVar31 + 0x40002 + uVar37 * 4);
                  uVar25 = (ulong)*(ushort *)(lVar31 + 0x40000 + uVar37 * 4);
                } while (ringbuffer_mask < local_d0 + uVar32);
                uVar37 = uVar41 - uVar51 & ringbuffer_mask;
              } while ((ringbuffer_mask < local_d0 + uVar37) ||
                      (ringbuffer[local_d0 + uVar32] != ringbuffer[local_d0 + uVar37]));
              uVar36 = 0;
              local_128 = 0;
LAB_001083c1:
              if (uVar23 == uVar36) {
                uVar36 = uVar17;
                for (local_128 = -local_128;
                    (bVar54 = uVar36 != 0, uVar36 = uVar36 - 1, bVar54 &&
                    (ringbuffer[local_128 + uVar37] == *(uint8_t *)((long)piVar2 + local_128)));
                    local_128 = local_128 + 1) {
                }
              }
              else {
                if (*(ulong *)(piVar2 + uVar36 * 2) == *(ulong *)(ringbuffer + uVar36 * 8 + uVar37))
                goto code_r0x001083de;
                uVar36 = *(ulong *)(ringbuffer + uVar36 * 8 + uVar37) ^
                         *(ulong *)(piVar2 + uVar36 * 2);
                uVar37 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                  }
                }
                local_128 = (uVar37 >> 3 & 0x1fffffff) - local_128;
              }
              if ((psVar44 < back_refs_position && !bVar55) &&
                 ((ulong)(long)(int)*psVar42 < local_128 + uVar41)) {
                local_128 = (long)(int)*psVar42 - uVar41;
              }
            } while (local_128 < 4);
            iVar34 = 0x1f;
            if ((uint)uVar51 != 0) {
              for (; (uint)uVar51 >> iVar34 == 0; iVar34 = iVar34 + -1) {
              }
            }
            uVar36 = (ulong)(iVar34 * -0x1e + 0x780) + local_128 * 0x87;
            uVar37 = uVar51;
            uVar43 = local_128;
          } while (uVar36 <= uVar26);
        } while( true );
      }
      if ((ulong)(long)(int)*psVar42 < uVar41) {
        psVar44 = (size_t *)((long)psVar44 + 1);
        *(size_t **)backward_references = psVar44;
        psVar42 = psVar42 + 2;
        goto LAB_00108173;
      }
      if (uVar41 != (long)(int)*psVar42 || bVar55) goto LAB_00108199;
      uVar53 = (ulong)(int)(uint)psVar42[1];
      if (uVar41 <= uVar41 - uVar53) {
        uVar53 = 0;
        local_170 = 0;
        goto LAB_00108848;
      }
      if ((uint)psVar42[1] <= *(uint *)((long)psVar42 + 0xc)) {
        uVar24 = uVar41 - uVar53 & ringbuffer_mask;
        uVar33 = 0;
        lVar31 = 0;
        goto LAB_00108974;
      }
      uVar53 = 0;
      local_170 = 0;
LAB_00108848:
      uVar26 = 0x7e4;
      iVar34 = 0;
      if (psVar44 < back_refs_position) {
        if (uVar41 == (long)(int)num_literals[(long)psVar44 * 2]) {
          iVar11 = (int)num_literals[(long)psVar44 * 2 + 1];
          if (*(int *)((long)num_literals + (long)psVar44 * 0x10 + 0xc) < iVar11) {
            uVar12 = *(uint *)((long)num_literals + (long)psVar44 * 0x10 + 4);
            uVar24 = (ulong)uVar12;
            iVar34 = 0;
            if (uVar12 - 4 < 0x15 && iVar11 < 0x7ffffffd) {
              uVar40 = ~(uint)uVar30 + iVar11;
              lVar31 = *(long *)(literal_context_lut + 0x58);
              if ((int)uVar40 >> (*(byte *)(lVar31 + uVar24) & 0x1f) <
                  *(int *)(literal_context_lut + 0x60)) {
                uVar39 = *(uint *)(lVar31 + 0x20 + uVar24 * 4);
                uVar8 = kBitMask[*(byte *)(lVar31 + uVar24)];
                lVar31 = *(long *)(lVar31 + 0xa8);
                uVar18 = BrotliGetTransforms();
                pvVar19 = malloc(uVar24 * 10);
                iVar14 = BrotliTransformDictionaryWord
                                   (pvVar19,(ulong)uVar39 + lVar31 +
                                            (long)(int)((uVar40 & uVar8) * uVar12),uVar12,uVar18);
                iVar13 = bcmp(piVar2,pvVar19,(long)iVar14);
                iVar34 = 0;
                if (iVar13 == 0) {
                  iVar34 = uVar12 - iVar14;
                  uVar53 = (long)iVar11;
                  local_170 = (long)iVar14;
                }
              }
            }
            goto LAB_00108aae;
          }
        }
LAB_0010887a:
        iVar34 = 0;
        uVar26 = 0x7e4;
      }
LAB_0010889e:
      if (uVar26 < uVar45 + 0xaf) {
        local_b8 = lVar9 + uVar33;
        if (uVar15 <= lVar9 + uVar33) {
          local_b8 = uVar15;
        }
        break;
      }
      uVar17 = uVar46 + 1;
      if (2 < uVar12) goto LAB_00108aae;
      uVar12 = uVar12 + 1;
      uVar23 = uVar33 + 5;
      uVar24 = uVar24 - 1;
      local_c0 = (ulong)(byte)((byte)local_c0 + 7);
      __n = local_170;
      uVar33 = uVar41;
      uVar45 = uVar26;
      uVar46 = uVar17;
      uVar16 = uVar53;
      iVar14 = iVar34;
    } while (uVar23 < uVar1);
  }
  goto LAB_00108ab3;
code_r0x00108232:
  lVar35 = lVar35 + -8;
  uVar51 = uVar51 + 1;
  goto LAB_00108215;
code_r0x001083de:
  local_128 = local_128 + -8;
  uVar36 = uVar36 + 1;
  goto LAB_001083c1;
LAB_001085b4:
  if (lVar35 == 2) goto LAB_0010889e;
  uVar17 = uVar17 + 1;
  *(ulong *)(lVar31 + 8) = uVar17;
  bVar20 = *(byte *)(lVar50 + uVar23);
  uVar30 = (ulong)bVar20;
  if ((uVar30 != 0) && (uVar30 <= local_110)) {
    uVar37 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar23 * 2);
    lVar10 = *(long *)(literal_context_lut + 0x58);
    lVar27 = uVar37 * uVar30 + *(long *)(lVar10 + 0xa8) +
             (ulong)*(uint *)(lVar10 + 0x20 + uVar30 * 4);
    uVar32 = (ulong)(bVar20 & 0xfffffff8);
    uVar48 = 0;
LAB_00108633:
    if (uVar32 == uVar48) {
      uVar36 = (ulong)(bVar20 & 7);
      pcVar28 = (char *)(lVar27 + uVar48);
      for (; (bVar54 = uVar36 != 0, uVar36 = uVar36 - 1, uVar48 = uVar30, bVar54 &&
             (uVar48 = uVar32, *(char *)((long)piVar2 + uVar32) == *pcVar28)); uVar32 = uVar32 + 1)
      {
        pcVar28 = pcVar28 + 1;
      }
    }
    else {
      uVar36 = *(ulong *)(lVar27 + uVar48);
      if (uVar36 == *(ulong *)((long)piVar2 + uVar48)) goto code_r0x0010864e;
      uVar36 = *(ulong *)((long)piVar2 + uVar48) ^ uVar36;
      uVar32 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
        }
      }
      uVar48 = (uVar32 >> 3 & 0x1fffffff) + uVar48;
    }
    if ((uVar48 != 0) &&
       ((uVar30 < *(uint *)(literal_context_lut + 100) + uVar48 &&
        (uVar30 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                 ((char)(uVar30 - uVar48) * '\x06' & 0x3fU)) & 0x3f) +
                   (uVar30 - uVar48) * 4 << (*(byte *)(lVar10 + uVar30) & 0x3f)) +
                  uVar37 + local_b8 + 1, uVar30 <= uVar47)))) {
      iVar11 = 0x1f;
      if ((uint)uVar30 != 0) {
        for (; (uint)uVar30 >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar32 = (uVar48 * 0x87 - (ulong)(uint)(iVar11 * 0x1e)) + 0x780;
      if (uVar26 <= uVar32) {
        iVar34 = (uint)bVar20 - (int)uVar48;
        local_140 = local_140 + 1;
        *(ulong *)(lVar31 + 0x10) = local_140;
        uVar26 = uVar32;
        local_170 = uVar48;
        uVar53 = uVar30;
      }
    }
  }
  lVar35 = lVar35 + 1;
  uVar23 = uVar23 + 1;
  goto LAB_001085b4;
code_r0x0010864e:
  uVar48 = uVar48 + 8;
  goto LAB_00108633;
LAB_00108974:
  if (uVar23 == uVar33) goto LAB_00108e57;
  if (*(ulong *)(piVar2 + uVar33 * 2) != *(ulong *)(ringbuffer + uVar33 * 8 + uVar24)) {
    uVar33 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar24) ^ *(ulong *)(piVar2 + uVar33 * 2);
    uVar24 = 0;
    if (uVar33 != 0) {
      for (; (uVar33 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
      }
    }
    uVar33 = (uVar24 >> 3 & 0x1fffffff) - lVar31;
    goto LAB_001089ac;
  }
  lVar31 = lVar31 + -8;
  uVar33 = uVar33 + 1;
  goto LAB_00108974;
LAB_00108e57:
  uVar17 = (ulong)((byte)local_c0 & 7);
  for (uVar33 = -lVar31;
      (bVar55 = uVar17 != 0, uVar17 = uVar17 - 1, bVar55 &&
      (ringbuffer[uVar33 + uVar24] == *(uint8_t *)((long)piVar2 + uVar33))); uVar33 = uVar33 + 1) {
  }
LAB_001089ac:
  local_170 = (long)*(int *)((long)psVar42 + 4);
  if (uVar33 < (ulong)(long)*(int *)((long)psVar42 + 4)) {
    local_170 = uVar33;
  }
  iVar34 = 0;
LAB_00108aae:
  __n = local_170;
  uVar33 = uVar41;
  uVar46 = uVar46 + 1;
  uVar16 = uVar53;
  iVar14 = iVar34;
LAB_00108ab3:
  if (local_b8 < uVar16) {
LAB_00108acf:
    uStack_180 = uVar16 + 0xf;
  }
  else {
    uVar24 = (ulong)*(int *)&(hasher->common).extra;
    if (uVar16 == uVar24) {
      uStack_180 = 0;
      goto LAB_00108b12;
    }
    uVar17 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
    uStack_180 = 1;
    if (uVar16 != uVar17) {
      uVar24 = (uVar16 + 3) - uVar24;
      if (uVar24 < 7) {
        bVar20 = (byte)((int)uVar24 << 2);
        uVar12 = 0x9750468;
      }
      else {
        uVar17 = (uVar16 + 3) - uVar17;
        if (6 < uVar17) {
          uStack_180 = 2;
          if ((uVar16 != (long)(int)(hasher->common).dict_num_lookups) &&
             (uStack_180 = 3, uVar16 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
             )) goto LAB_00108acf;
          goto LAB_00108ad3;
        }
        bVar20 = (byte)((int)uVar17 << 2);
        uVar12 = 0xfdb1ace;
      }
      uStack_180 = (ulong)(uVar12 >> (bVar20 & 0x1f) & 0xf);
    }
  }
LAB_00108ad3:
  if ((uVar16 <= local_b8) && (uStack_180 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)uVar16;
  }
LAB_00108b12:
  uVar12 = (uint)uVar46;
  *(uint *)local_a8 = uVar12;
  local_170._0_4_ = (uint)__n;
  *(uint *)((long)local_a8 + 4) = iVar14 << 0x19 | (uint)local_170;
  uVar24 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar40 = 0;
  if (uVar24 <= uStack_180) {
    bVar20 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar17 = ((4L << (bVar20 & 0x3f)) + (uStack_180 - *(uint *)(literal_context_lut + 0x44))) - 0x10
    ;
    uVar40 = 0x1f;
    uVar39 = (uint)uVar17;
    if (uVar39 != 0) {
      for (; uVar39 >> uVar40 == 0; uVar40 = uVar40 - 1) {
      }
    }
    uVar40 = (uVar40 ^ 0xffffffe0) + 0x1f;
    uVar23 = (ulong)((uVar17 >> ((ulong)uVar40 & 0x3f) & 1) != 0);
    lVar31 = (ulong)uVar40 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uStack_180 = (~(-1 << (bVar20 & 0x1f)) & uVar39) + uVar24 +
                 (uVar23 + lVar31 * 2 + 0xfffe << (bVar20 & 0x3f)) | lVar31 * 0x400;
    uVar40 = (uint)(uVar17 - (uVar23 + 2 << ((byte)uVar40 & 0x3f)) >> (bVar20 & 0x3f));
  }
  *(short *)((long)local_a8 + 0xe) = (short)uStack_180;
  *(uint *)(local_a8 + 1) = uVar40;
  if (5 < uVar46) {
    if (uVar46 < 0x82) {
      uVar12 = 0x1f;
      uVar40 = (uint)(uVar46 - 2);
      if (uVar40 != 0) {
        for (; uVar40 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar12 = (int)(uVar46 - 2 >> ((char)(uVar12 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar12 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar46 < 0x842) {
      uVar40 = 0x1f;
      if (uVar12 - 0x42 != 0) {
        for (; uVar12 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar12 = (uVar40 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar12 = 0x15;
      if (0x1841 < uVar46) {
        uVar12 = (uint)(ushort)(0x17 - (uVar46 < 0x5842));
      }
    }
  }
  local_170._0_4_ = iVar14 + (uint)local_170;
  if ((uint)local_170 < 10) {
    uVar40 = (uint)local_170 - 2;
  }
  else if ((uint)local_170 < 0x86) {
    local_170._0_4_ = (uint)local_170 - 6;
    uVar40 = 0x1f;
    if ((uint)local_170 != 0) {
      for (; (uint)local_170 >> uVar40 == 0; uVar40 = uVar40 - 1) {
      }
    }
    uVar40 = ((uint)local_170 >> ((char)(uVar40 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar40 ^ 0xffffffe0) * 2;
  }
  else {
    uVar40 = 0x17;
    if ((uint)local_170 < 0x846) {
      uVar40 = 0x1f;
      if ((uint)local_170 - 0x46 != 0) {
        for (; (uint)local_170 - 0x46 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar40 = (uVar40 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar40;
  sVar29 = (uVar6 & 7) + ((ushort)uVar12 & 7) * 8;
  if ((((uStack_180 & 0x3ff) == 0) && ((ushort)uVar12 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      sVar29 = sVar29 + 0x40;
    }
  }
  else {
    iVar14 = ((uVar12 & 0xffff) >> 3) * 3 + ((uVar40 & 0xffff) >> 3);
    sVar29 = sVar29 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar14 * 0x40 + 0x40;
  }
  *(short *)((long)local_a8 + 0xc) = sVar29;
  *num_commands = *num_commands + uVar46;
  position = __n + uVar33;
  uVar46 = sVar21;
  if (position < sVar21) {
    uVar46 = position;
  }
  uVar17 = uVar33 + 2;
  if (uVar16 < __n >> 2) {
    uVar24 = position + uVar16 * -4;
    if (uVar24 < uVar17) {
      uVar24 = uVar17;
    }
    uVar17 = uVar24;
    if (uVar46 < uVar24) {
      uVar17 = uVar46;
    }
  }
  uVar24 = lVar22 + __n * 2 + uVar33;
  local_a8 = local_a8 + 2;
  for (; uVar17 < uVar46; uVar17 = uVar17 + 1) {
    lVar31 = *(long *)&params->dist;
    uVar12 = (uint)(*(int *)(ringbuffer + (uVar17 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar33 = (ulong)uVar12;
    uVar6 = (ushort)(params->hasher).block_bits;
    *(ushort *)&(params->hasher).block_bits = uVar6 + 1;
    uVar23 = uVar17 - *(uint *)(lVar31 + uVar33 * 4);
    *(char *)(lVar31 + 0x30000 + (uVar17 & 0xffff)) = (char)uVar12;
    if (0xfffe < uVar23) {
      uVar23 = 0xffff;
    }
    *(short *)(lVar31 + 0x40000 + (ulong)uVar6 * 4) = (short)uVar23;
    *(undefined2 *)(lVar31 + 0x40002 + (ulong)uVar6 * 4) =
         *(undefined2 *)(lVar31 + 0x20000 + uVar33 * 2);
    *(int *)(lVar31 + uVar33 * 4) = (int)uVar17;
    *(ushort *)(lVar31 + 0x20000 + uVar33 * 2) = uVar6;
  }
  uVar46 = 0;
  goto LAB_001075f5;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}